

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O1

void la_adsc_format_json(la_vstring *vstr,void *data)

{
  la_adsc_msg_t *msg;
  la_adsc_formatter_ctx_t ctx;
  la_vstring *local_28;
  undefined4 local_20;
  
  if (*(long *)((long)data + 8) != 0) {
    local_20 = 0;
    local_28 = vstr;
    la_json_array_start(vstr,"tags");
    la_list_foreach(*(la_list **)((long)data + 8),la_adsc_tag_output_json,&local_28);
    la_json_array_end(vstr);
    la_json_append_bool(vstr,"err",*data);
  }
  return;
}

Assistant:

void la_adsc_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_adsc_msg_t const *msg = data;
	if(msg->tag_list == NULL) {
		return;
	}
	la_adsc_formatter_ctx_t ctx = {
		.vstr = vstr,
		.indent = 0     // unused in JSON output
	};
	la_json_array_start(vstr, "tags");
	la_list_foreach(msg->tag_list, la_adsc_tag_output_json, &ctx);
	la_json_array_end(vstr);
	la_json_append_bool(vstr, "err", msg->err);
}